

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O3

int __thiscall CVmRun::xor_and_push(CVmRun *this,vm_val_t *val1,vm_val_t *val2)

{
  vm_datatype_t vVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  vm_datatype_t vVar5;
  bool bVar6;
  
  vVar5 = val1->typ;
  vVar1 = val2->typ;
  if (vVar5 - VM_STACK < 0xfffffffe) {
    if (vVar1 - VM_STACK < 0xfffffffe) {
      if (vVar1 != VM_INT || vVar5 != VM_INT) {
        return 0;
      }
      (val1->val).obj = (val1->val).obj ^ (val2->val).obj;
      goto LAB_001e68ec;
    }
    if (vVar5 != VM_INT) {
LAB_001e690b:
      err_throw(0x7d6);
    }
    vVar5 = VM_TRUE - ((val1->val).obj == 0);
    val1->typ = vVar5;
    bVar6 = val2->typ != VM_TRUE;
LAB_001e68c8:
    bVar6 = (bool)(vVar5 == VM_TRUE ^ bVar6);
  }
  else {
    if (vVar1 - VM_STACK < 0xfffffffe) {
      if (vVar1 != VM_INT) goto LAB_001e690b;
      bVar6 = (val2->val).obj == 0;
      val2->typ = VM_TRUE - bVar6;
      vVar5 = val1->typ;
      goto LAB_001e68c8;
    }
    bVar6 = (vVar1 != VM_TRUE) != (vVar5 == VM_TRUE);
  }
  val1->typ = VM_TRUE - bVar6;
LAB_001e68ec:
  pvVar4 = sp_;
  uVar3 = *(undefined4 *)&val1->field_0x4;
  aVar2 = val1->val;
  sp_ = sp_ + 1;
  pvVar4->typ = val1->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar3;
  pvVar4->val = aVar2;
  return 1;
}

Assistant:

int CVmRun::xor_and_push(VMG_ vm_val_t *val1, vm_val_t *val2)
{
    /* figure what to do based on the types */
    if (val1->is_logical() && val2->is_logical())
    {
        /* both values are logical - compute the logical XOR */
        val1->set_logical(val1->get_logical() ^ val2->get_logical());
    }
    else if (val1->is_logical() || val2->is_logical())
    {
        /* 
         *   one value is logical, but not both - convert the other value
         *   from a number to a logical and compute the result as a
         *   logical value 
         */
        if (!val1->is_logical())
            val1->num_to_logical();
        else if (!val2->is_logical())
            val2->num_to_logical();

        /* compute the logical xor */
        val1->set_logical(val1->get_logical() ^ val2->get_logical());
    }
    else if (val1->typ == VM_INT && val2->typ == VM_INT)
    {
        /* compute and store the bitwise XOR */
        val1->val.intval = val1->val.intval ^ val2->val.intval;
    }
    else
    {
        /* there's no logical conversion, so we can't compute it here */
        return FALSE;
    }

    /* push the result */
    pushval(vmg_ val1);

    /* handled */
    return TRUE;
}